

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O2

O3DGCErrorCode __thiscall
o3dgc::CompressedTriangleFans::SaveUIntAC
          (CompressedTriangleFans *this,Vector<long> *data,unsigned_long M,BinaryStream *bstream)

{
  unsigned_long position;
  unsigned_long value;
  uint uVar1;
  uchar *puVar2;
  unsigned_long uVar3;
  unsigned_long i_1;
  unsigned_long value_00;
  unsigned_long i_2;
  ulong uVar4;
  Arithmetic_Codec ace;
  Adaptive_Data_Model mModelValues;
  Arithmetic_Codec local_98;
  Adaptive_Data_Model local_68;
  
  position = (bstream->m_stream).m_size;
  value = data->m_size;
  BinaryStream::WriteUInt32Bin(bstream,0);
  BinaryStream::WriteUInt32Bin(bstream,value);
  if (value != 0) {
    uVar1 = (int)value * 8 + 100;
    value_00 = 0x7fffffff;
    for (uVar3 = 0; value != uVar3; uVar3 = uVar3 + 1) {
      if (data->m_buffer[uVar3] <= (long)value_00) {
        value_00 = data->m_buffer[uVar3];
      }
    }
    BinaryStream::WriteUInt32Bin(bstream,value_00);
    uVar4 = (ulong)uVar1;
    if (this->m_sizeBufferAC < uVar4) {
      if (this->m_bufferAC != (uchar *)0x0) {
        operator_delete__(this->m_bufferAC);
      }
      this->m_sizeBufferAC = uVar4;
      puVar2 = (uchar *)operator_new__(uVar4);
      this->m_bufferAC = puVar2;
    }
    Arithmetic_Codec::Arithmetic_Codec(&local_98);
    Arithmetic_Codec::set_buffer(&local_98,uVar1,this->m_bufferAC);
    Arithmetic_Codec::start_encoder(&local_98);
    Adaptive_Data_Model::Adaptive_Data_Model(&local_68,(int)M + 1);
    for (uVar3 = 0; value != uVar3; uVar3 = uVar3 + 1) {
      Arithmetic_Codec::encode(&local_98,(int)data->m_buffer[uVar3] - (int)value_00,&local_68);
    }
    uVar1 = Arithmetic_Codec::stop_encoder(&local_98);
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      BinaryStream::WriteUChar8Bin(bstream,this->m_bufferAC[uVar4]);
    }
    Adaptive_Data_Model::~Adaptive_Data_Model(&local_68);
    Arithmetic_Codec::~Arithmetic_Codec(&local_98);
  }
  BinaryStream::WriteUInt32Bin(bstream,position,(bstream->m_stream).m_size - position);
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    CompressedTriangleFans::SaveUIntAC(const Vector<long> & data,
                                                         const unsigned long M,
                                                         BinaryStream & bstream) 
    {
        unsigned long start = bstream.GetSize();     
        const unsigned int NMAX = data.GetSize() * 8 + 100;
        const unsigned long size       = data.GetSize();
        long minValue = O3DGC_MAX_LONG;
        bstream.WriteUInt32Bin(0);
        bstream.WriteUInt32Bin(size);
        if (size > 0)
        {
    #ifdef DEBUG_VERBOSE
            printf("-----------\nsize %i, start %i\n", size, start);
            fprintf(g_fileDebugTF, "-----------\nsize %i, start %i\n", size, start);
    #endif //DEBUG_VERBOSE

            for(unsigned long i = 0; i < size; ++i)
            {
                if (minValue > data[i]) 
                {
                    minValue = data[i];
                }
    #ifdef DEBUG_VERBOSE
                printf("%i\t%i\n", i, data[i]);
                fprintf(g_fileDebugTF, "%i\t%i\n", i, data[i]);
    #endif //DEBUG_VERBOSE
            }
            bstream.WriteUInt32Bin(minValue);
            if ( m_sizeBufferAC < NMAX )
            {
                delete [] m_bufferAC;
                m_sizeBufferAC = NMAX;
                m_bufferAC     = new unsigned char [m_sizeBufferAC];
            }
            Arithmetic_Codec ace;
            ace.set_buffer(NMAX, m_bufferAC);
            ace.start_encoder();
            Adaptive_Data_Model mModelValues(M+1);
            for(unsigned long i = 0; i < size; ++i)
            {
                ace.encode(data[i]-minValue, mModelValues);
            }
            unsigned long encodedBytes = ace.stop_encoder();
            for(unsigned long i = 0; i < encodedBytes; ++i)
            {
                bstream.WriteUChar8Bin(m_bufferAC[i]);
            }
        }
        bstream.WriteUInt32Bin(start, bstream.GetSize() - start);
        return O3DGC_OK;
    }